

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void dequantize_row_iq2_xxs(block_iq2_xxs *x,float *y,int64_t k)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  int l;
  long lVar7;
  int j;
  long lVar8;
  int ib32;
  long lVar9;
  float fVar10;
  undefined8 local_38;
  uint32_t aux32 [2];
  
  lVar6 = 0;
  lVar5 = k / 0x100;
  if (k / 0x100 < 1) {
    lVar5 = lVar6;
  }
  for (; lVar6 != lVar5; lVar6 = lVar6 + 1) {
    fVar1 = ggml_table_f32_f16[x[lVar6].d];
    for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
      local_38 = *(undefined8 *)(x[lVar6].qs + lVar9 * 4);
      uVar4 = (uint)((ulong)*(undefined8 *)(x[lVar6].qs + lVar9 * 4) >> 0x20);
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        bVar2 = *(byte *)((long)&local_38 + lVar7);
        bVar3 = ""[uVar4 >> ((char)lVar7 * '\a' & 0x1fU) & 0x7f];
        for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
          fVar10 = (float)*(byte *)((long)iq2xxs_grid + lVar8 + (ulong)bVar2 * 8) *
                   ((float)(uVar4 >> 0x1c) + 0.5) * fVar1 * 0.25;
          if ((kmask_iq2xs[lVar8] & bVar3) != 0) {
            fVar10 = -fVar10;
          }
          y[lVar8] = fVar10;
        }
        y = y + 8;
      }
    }
  }
  return;
}

Assistant:

void dequantize_row_iq2_xxs(const block_iq2_xxs * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    uint32_t aux32[2];
    const uint8_t * aux8 = (const uint8_t *)aux32;

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);

        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            memcpy(aux32, x[i].qs + 4*ib32, 2*sizeof(uint32_t));
            const float db = d * (0.5f + (aux32[1] >> 28)) * 0.25f;
            for (int l = 0; l < 4; ++l) {
                const uint8_t * grid = (const uint8_t *)(iq2xxs_grid + aux8[l]);
                const uint8_t  signs = ksigns_iq2xs[(aux32[1] >> 7*l) & 127];
                for (int j = 0; j < 8; ++j) {
                    y[j] = db * grid[j] * (signs & kmask_iq2xs[j] ? -1.f : 1.f);
                }
                y += 8;
            }
        }
    }
}